

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double units::numericalRoot<double>(double value,int power)

{
  double dVar1;
  
  switch(power) {
  case 0:
    return 1.0;
  case 1:
    goto switchD_00318d31_caseD_1;
  case 2:
    if (0.0 <= value) goto LAB_00318e2a;
    break;
  case 4:
    if (0.0 <= value) {
      if (value < 0.0) goto LAB_00318e21;
      value = SQRT(value);
      goto LAB_00318e2a;
    }
    break;
  case -4:
    if (0.0 <= value) {
      value = 1.0 / value;
      if (value < 0.0) {
LAB_00318e21:
        value = sqrt(value);
      }
      else {
        value = SQRT(value);
      }
LAB_00318e2a:
      if (0.0 <= value) {
        return SQRT(value);
      }
LAB_00318e36:
      dVar1 = sqrt(value);
      return dVar1;
    }
    break;
  case -3:
    value = 1.0 / value;
  case 3:
    dVar1 = cbrt(value);
    return dVar1;
  case -2:
    if (0.0 <= value) {
      value = 1.0 / value;
      if (0.0 <= value) {
        return SQRT(value);
      }
      goto LAB_00318e36;
    }
    break;
  case -1:
    return 1.0 / value;
  default:
    if (0.0 <= value || (power & 1U) != 0) {
      dVar1 = pow(value,1.0 / (double)power);
      return dVar1;
    }
  }
  value = NAN;
switchD_00318d31_caseD_1:
  return value;
}

Assistant:

X numericalRoot(X value, int power)
{
    switch (power) {
        case 0:
            return X{1.0};
        case 1:
            return value;
        case -1:
            return X{1.0} / value;
        case 2:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(value);
        case -2:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(X{1.0} / value);
        case 3:
            return std::cbrt(value);
        case -3:
            return std::cbrt(X{1.0} / value);
        case 4:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(std::sqrt(value));
        case -4:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(std::sqrt(X{1.0} / value));
        default:
            if (value < X{0.0} && power % 2 == 0) {
                return constants::invalid_conversion;
            }
            return std::pow(value, X{1.0} / static_cast<X>(power));
    }
}